

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestExternalTests.cpp
# Opt level: O3

TestResults __thiscall
ExternalTester::getError
          (ExternalTester *this,BaseFunction *f,TasmanianSparseGrid *grid,TestType type,
          vector<double,_std::allocator<double>_> *x)

{
  uint num_dimensions;
  uint uVar1;
  uint uVar2;
  long lVar3;
  pointer pdVar4;
  pointer pdVar5;
  uint *puVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined8 uVar19;
  undefined8 uVar20;
  double dVar21;
  TestResults TVar22;
  vector<double,_std::allocator<double>_> y;
  vector<double,_std::allocator<double>_> r;
  vector<double,_std::allocator<double>_> points;
  vector<double,_std::allocator<double>_> local_d0;
  BaseFunction *local_b8;
  allocator_type local_a9;
  ulong local_a8;
  vector<double,_std::allocator<double>_> local_a0;
  undefined8 local_88;
  undefined8 uStack_80;
  vector<double,_std::allocator<double>_> local_78;
  pointer local_60;
  TasmanianSparseGrid *local_58;
  vector<double,_std::allocator<double>_> *local_50;
  ulong local_48;
  long local_40;
  value_type_conflict1 local_38;
  
  uVar9 = (ulong)type;
  num_dimensions = (**f->_vptr_BaseFunction)(f);
  local_b8 = f;
  uVar1 = (*f->_vptr_BaseFunction[1])(f);
  lVar3 = *(long *)(grid + 8);
  if (lVar3 == 0) {
    uVar2 = 0;
  }
  else {
    puVar6 = (uint *)(lVar3 + 0x20);
    if (*(long *)(lVar3 + 0x28) == *(long *)(lVar3 + 0x30)) {
      puVar6 = (uint *)(lVar3 + 0x48);
    }
    uVar2 = *puVar6;
  }
  if (type < type_internal_interpolation) {
    uVar7 = 1;
    if (type == type_nodal_differentiation) {
      uVar7 = num_dimensions;
    }
    TasGrid::TasmanianSparseGrid::getPoints(&local_78,grid);
    local_50 = x;
    if (type == type_integration) {
      TasGrid::TasmanianSparseGrid::getQuadratureWeights(&local_d0,grid);
    }
    else if (type == type_nodal_interpolation) {
      TasGrid::TasmanianSparseGrid::getInterpolationWeights((vector *)&local_d0);
    }
    else {
      TasGrid::TasmanianSparseGrid::getDifferentiationWeights((vector *)&local_d0);
    }
    pdVar4 = local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_60 = local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    uVar7 = uVar7 * uVar1;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_d0,(long)(int)uVar7,(allocator_type *)&local_a0);
    local_38 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_a0,(long)(int)uVar7,&local_38,&local_a9);
    if (type == type_nodal_differentiation) {
      if ((int)uVar2 < 1) {
        lVar3 = 0x28;
        goto LAB_0011c38b;
      }
      local_88 = (double)CONCAT44(local_88._4_4_,uVar7);
      local_40 = (long)(int)num_dimensions;
      uVar13 = 0;
      uVar11 = 0;
      local_a8 = uVar9;
      local_58 = grid;
      local_48 = (ulong)uVar2;
      do {
        (*local_b8->_vptr_BaseFunction[3])
                  (local_b8,local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + uVar11 * local_40,
                   local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start);
        if (0 < (int)uVar1) {
          uVar9 = 0;
          pdVar5 = local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            if (0 < (int)num_dimensions) {
              uVar10 = 0;
              do {
                pdVar5[uVar10] =
                     pdVar4[uVar13 + uVar10] *
                     local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar9] + pdVar5[uVar10];
                uVar10 = uVar10 + 1;
              } while (num_dimensions != uVar10);
            }
            uVar9 = uVar9 + 1;
            pdVar5 = pdVar5 + num_dimensions;
          } while (uVar9 != uVar1);
        }
        uVar11 = uVar11 + 1;
        uVar13 = (ulong)((int)uVar13 + num_dimensions);
      } while (uVar11 != local_48);
LAB_0011c21b:
      grid = local_58;
      uVar7 = (uint)local_88;
      if ((int)local_a8 != 0) {
        lVar3 = 0x28;
        if ((int)local_a8 != 2) goto LAB_0011c386;
        goto LAB_0011c38b;
      }
LAB_0011c3a0:
      (*local_b8->_vptr_BaseFunction[4])
                (local_b8,local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
    }
    else {
      if (0 < (int)uVar2) {
        local_88 = (double)CONCAT44(local_88._4_4_,uVar7);
        uVar11 = 0;
        local_a8 = uVar9;
        local_58 = grid;
        do {
          (*local_b8->_vptr_BaseFunction[3])
                    (local_b8,local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + uVar11 * (long)(int)num_dimensions,
                     local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
          if (0 < (int)(uint)local_88) {
            uVar9 = 0;
            do {
              local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9] =
                   pdVar4[uVar11] *
                   local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar9] +
                   local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar9];
              uVar9 = uVar9 + 1;
            } while (uVar7 != uVar9);
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar2);
        goto LAB_0011c21b;
      }
      if (type == type_integration) goto LAB_0011c3a0;
LAB_0011c386:
      lVar3 = 0x18;
LAB_0011c38b:
      (**(code **)((long)local_b8->_vptr_BaseFunction + lVar3))
                (local_b8,(local_50->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start,
                 local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start);
    }
    if ((int)uVar7 < 1) {
      local_88 = 0.0;
      uStack_80 = 0.0;
      if (local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) goto LAB_0011c3f3;
    }
    else {
      local_88 = 0.0;
      uVar9 = 0;
      do {
        local_88 = local_88 +
                   ABS(local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar9] -
                       local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar9]);
        uVar9 = uVar9 + 1;
      } while (uVar7 != uVar9);
LAB_0011c3f3:
      uStack_80 = 0.0;
      operator_delete(local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    pdVar5 = local_60;
    if (local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
      pdVar5 = local_60;
    }
  }
  else {
    if (1 < type - type_internal_interpolation) goto LAB_0011c4ae;
    loadValues(local_b8,grid);
    genRandom(&local_78,this->num_mc,num_dimensions);
    uVar2 = 1;
    if (type != type_internal_interpolation) {
      uVar2 = num_dimensions;
    }
    uVar1 = uVar1 * uVar2;
    lVar3 = (long)(int)uVar1;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_d0,this->num_mc * lVar3,(allocator_type *)&local_a0);
    std::vector<double,_std::allocator<double>_>::vector
              (&local_a0,this->num_mc * lVar3,(allocator_type *)&local_38);
    uVar2 = this->num_mc;
    if (type == type_internal_interpolation) {
      if (0 < (int)uVar2) {
        lVar14 = 0;
        lVar12 = 0;
        lVar8 = 0;
        local_a8 = uVar9;
        do {
          TasGrid::TasmanianSparseGrid::evaluate
                    ((double *)grid,
                     (double *)
                     ((long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar14));
          (*local_b8->_vptr_BaseFunction[3])
                    (local_b8,(long)local_78.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar14,
                     (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar12);
          lVar8 = lVar8 + 1;
          uVar2 = this->num_mc;
          lVar12 = lVar12 + lVar3 * 8;
          lVar14 = lVar14 + (long)(int)num_dimensions * 8;
        } while (lVar8 < (int)uVar2);
LAB_0011c2bb:
        type = (TestType)local_a8;
      }
    }
    else if (0 < (int)uVar2) {
      lVar14 = 0;
      lVar12 = 0;
      lVar8 = 0;
      local_a8 = uVar9;
      do {
        TasGrid::TasmanianSparseGrid::differentiate
                  ((double *)grid,
                   (double *)
                   ((long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar14));
        (*local_b8->_vptr_BaseFunction[5])
                  (local_b8,(long)local_78.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar14,
                   (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar12);
        lVar8 = lVar8 + 1;
        uVar2 = this->num_mc;
        lVar12 = lVar12 + lVar3 * 8;
        lVar14 = lVar14 + (long)(int)num_dimensions * 8;
      } while (lVar8 < (int)uVar2);
      goto LAB_0011c2bb;
    }
    if ((int)uVar1 < 1) {
      local_88 = 0.0;
      uStack_80 = 0.0;
    }
    else {
      local_88 = 0.0;
      uVar9 = 0;
      pdVar4 = local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        if ((int)uVar2 < 1) {
          auVar18 = ZEXT816(0);
        }
        else {
          uVar19 = 0;
          uVar20 = 0;
          lVar3 = 0;
          uVar11 = (ulong)uVar2;
          do {
            auVar17._0_8_ =
                 ABS(*(double *)((long)pdVar4 + lVar3) - *(double *)((long)pdVar5 + lVar3));
            auVar17._8_8_ = ABS(*(double *)((long)pdVar4 + lVar3));
            auVar18._8_8_ = uVar20;
            auVar18._0_8_ = uVar19;
            auVar18 = maxpd(auVar17,auVar18);
            lVar3 = lVar3 + (ulong)uVar1 * 8;
            uVar19 = auVar18._0_8_;
            uVar20 = auVar18._8_8_;
            uVar11 = uVar11 - 1;
          } while (uVar11 != 0);
        }
        uStack_80 = auVar18._8_8_;
        dVar21 = (double)(~-(ulong)(ABS(uStack_80) <= 1e-12) & (ulong)(auVar18._0_8_ / uStack_80) |
                         (ulong)auVar18._0_8_ & -(ulong)(ABS(uStack_80) <= 1e-12));
        if (dVar21 <= local_88) {
          dVar21 = local_88;
        }
        local_88 = dVar21;
        uVar9 = uVar9 + 1;
        pdVar5 = pdVar5 + 1;
        pdVar4 = pdVar4 + 1;
      } while (uVar9 != uVar1);
    }
    if (type == type_internal_differentiation) {
      dVar21 = unitDerivativeTests(local_b8,grid);
      uVar15 = SUB84(dVar21,0);
      uVar16 = (undefined4)((ulong)dVar21 >> 0x20);
      if (dVar21 <= local_88) {
        uVar15 = SUB84(local_88,0);
        uVar16 = (undefined4)((ulong)local_88 >> 0x20);
      }
      local_88 = (double)CONCAT44(uVar16,uVar15);
      uStack_80 = (double)CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
    }
    pdVar4 = local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
      pdVar4 = local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
  }
  if (pdVar4 != (pointer)0x0) {
    operator_delete(pdVar4,(long)pdVar5 - (long)pdVar4);
  }
  if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_0011c4ae:
  lVar3 = *(long *)(grid + 8);
  if (lVar3 == 0) {
    uVar9 = 0;
  }
  else {
    puVar6 = (uint *)(lVar3 + 0x20);
    if (*(long *)(lVar3 + 0x28) == *(long *)(lVar3 + 0x30)) {
      puVar6 = (uint *)(lVar3 + 0x48);
    }
    uVar9 = (ulong)*puVar6;
  }
  TVar22._8_8_ = uVar9;
  TVar22.error = local_88;
  return TVar22;
}

Assistant:

TestResults ExternalTester::getError(const BaseFunction *f, TasGrid::TasmanianSparseGrid &grid, TestType type, std::vector<double> const &x) const{
    TestResults R;
    int num_dimensions = f->getNumInputs();
    int num_outputs = f->getNumOutputs();
    int num_points = grid.getNumPoints();
    if (type == type_integration or type == type_nodal_interpolation or type == type_nodal_differentiation){
        int num_entries = (type == type_nodal_differentiation) ? num_dimensions * num_outputs : num_outputs;
        auto points = grid.getPoints();
        std::vector<double> weights;
        if (type == type_integration)
            weights = grid.getQuadratureWeights();
        else if (type == type_nodal_interpolation)
            weights = grid.getInterpolationWeights(x);
        else
            weights = grid.getDifferentiationWeights(x);

        // Sequential version
        std::vector<double> y(num_entries);
        std::vector<double> r(num_entries, 0.0);
        if (type == type_nodal_differentiation){
            for(int i=0; i<num_points; i++){
                f->eval(&(points[i*num_dimensions]), y.data());
                for (int k=0; k<num_outputs; k++)
                    for(int j=0; j<num_dimensions; j++)
                        r[k * num_dimensions + j] += weights[i * num_dimensions + j] * y[k];
            }
        }else{
            for(int i=0; i<num_points; i++){
                f->eval(&(points[i*num_dimensions]), y.data());
                for(int k=0; k<num_entries; k++)
                    r[k] += weights[i] * y[k];
            }
        }

        double err = 0.0;
        if (type == type_integration){
            f->getIntegral(y.data());
        }else if (type == type_nodal_differentiation){
            f->getDerivative(x.data(), y.data());
        }else{
            f->eval(x.data(), y.data());
        }
        for(int j=0; j<num_entries; j++){
            err += std::abs(y[j] - r[j]);
        };
        R.error = err;
    }else if (type == type_internal_interpolation or type == type_internal_differentiation){
        // load needed points
        loadValues(f, grid);

        std::vector<double> test_x = genRandom(num_mc, num_dimensions);
        int num_entries = (type == type_internal_interpolation) ? num_outputs : num_outputs * num_dimensions;
        std::vector<double> result_tasm(num_mc * num_entries);
        std::vector<double> result_true(num_mc * num_entries);
        if (type == type_internal_interpolation) {
            #pragma omp parallel for // note that iterators do not work with OpenMP, direct indexing does
            for(int i=0; i<num_mc; i++){
                grid.evaluate(&(test_x[i * num_dimensions]), &(result_tasm[i * num_entries]));
                f->eval(&(test_x[i * num_dimensions]), &(result_true[i * num_entries]));
            }
        } else {
            #pragma omp parallel for // note that iterators do not work with OpenMP, direct indexing does
            for(int i=0; i<num_mc; i++){
                grid.differentiate(&(test_x[i * num_dimensions]), &(result_tasm[i * num_entries]));
                f->getDerivative(&(test_x[i * num_dimensions]), &(result_true[i * num_entries]));
            }
        }

        double rel_err = 0.0; // relative error
        for(int k=0; k<num_entries; k++){
            double nrm = 0.0; // norm, needed to compute relative error
            double err = 0.0; // absolute error
            for(int i=0; i<num_mc; i++){
                nrm = std::max(nrm, std::fabs(result_true[i * num_entries + k]));
                err = std::max(err, std::fabs(result_true[i * num_entries + k] - result_tasm[i * num_entries + k]));
            }
            rel_err = std::max(rel_err, std::fabs(nrm) <= Maths::num_tol ? err : err / nrm);
        }

        if (type == type_internal_differentiation)
            rel_err = std::max(rel_err, unitDerivativeTests(f, grid));

        R.error = rel_err;
    }
    R.num_points = grid.getNumPoints();
    return R;
}